

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.hpp
# Opt level: O1

void __thiscall
Lodtalk::MethodDictionary::internalAtPut
          (MethodDictionary *this,VMContext *context,Oop key,Oop value)

{
  long lVar1;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar2;
  long lVar3;
  undefined8 *puVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t newCapacity;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  OopRef valueRef;
  OopRef keyRef;
  anon_union_8_4_0eb573b0_for_Oop_0 local_60;
  VMContext *local_58;
  anon_union_8_4_0eb573b0_for_Oop_0 local_40;
  VMContext *local_38;
  
  uVar6 = *(ulong *)(this + 8);
  if ((uVar6 & 1) != 0) {
    uVar8 = 0xffffffffffffffff;
    uVar11 = uVar8;
    if (1 < uVar6) {
      if (((ulong)key.field_0 & 1) == 0) {
        uVar5 = key.field_0._0_4_ & 6;
        if ((uVar5 == 4) || (uVar5 == 2)) {
          uVar5 = (uint)((ulong)key.field_0 >> 3);
        }
        else {
          uVar5 = *(uint *)key.field_0 >> 10;
        }
      }
      else {
        uVar5 = (uint)((ulong)key.field_0 >> 1);
      }
      uVar7 = (ulong)(long)(int)uVar5 % (ulong)((long)uVar6 >> 1);
      lVar1 = *(long *)(this + 0x18);
      if (lVar1 == 0) {
        __assert_fail("keyValues",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/Collections.hpp"
                      ,0xc1,"Oop *Lodtalk::HashedCollection::getHashTableKeyValues() const");
      }
      aVar2 = (anon_union_8_4_0eb573b0_for_Oop_0)
              ((anon_union_8_4_0eb573b0_for_Oop_0 *)(lVar1 + 8 + uVar7 * 8))->pointer;
      bVar12 = true;
      uVar10 = uVar7;
      uVar11 = uVar7;
      if ((anon_union_8_4_0eb573b0_for_Oop_0)aVar2.pointer != key.field_0 &&
          aVar2.pointer != (uint8_t *)&NilObject) {
        while( true ) {
          uVar11 = uVar11 + 1;
          bVar12 = uVar11 < (ulong)((long)uVar6 >> 1);
          if (!bVar12) break;
          aVar2 = (anon_union_8_4_0eb573b0_for_Oop_0)
                  ((anon_union_8_4_0eb573b0_for_Oop_0 *)(lVar1 + 8 + uVar11 * 8))->pointer;
          uVar9 = uVar10;
          if ((anon_union_8_4_0eb573b0_for_Oop_0)aVar2.pointer == key.field_0) {
            uVar9 = uVar11;
          }
          uVar10 = uVar11;
          if ((aVar2.pointer == (uint8_t *)&NilObject) ||
             (uVar10 = uVar9, (anon_union_8_4_0eb573b0_for_Oop_0)aVar2.pointer == key.field_0))
          break;
        }
      }
      uVar11 = uVar10;
      if ((!bVar12) && (uVar11 = uVar8, uVar7 != 0)) {
        uVar6 = 0;
        do {
          aVar2 = (anon_union_8_4_0eb573b0_for_Oop_0)
                  ((anon_union_8_4_0eb573b0_for_Oop_0 *)(lVar1 + 8 + uVar6 * 8))->pointer;
          if ((anon_union_8_4_0eb573b0_for_Oop_0)aVar2.pointer == key.field_0) {
            uVar10 = uVar6;
          }
          uVar11 = uVar6;
        } while (((aVar2.pointer != (uint8_t *)&NilObject) &&
                 (uVar11 = uVar10, (anon_union_8_4_0eb573b0_for_Oop_0)aVar2.pointer != key.field_0))
                && (uVar6 = uVar6 + 1, uVar11 = uVar8, uVar6 < uVar7));
      }
    }
    if ((long)uVar11 < 0) {
      local_40 = key.field_0;
      local_38 = context;
      OopRef::registerSelf((OopRef *)&local_40);
      local_60 = value.field_0;
      local_58 = context;
      OopRef::registerSelf((OopRef *)&local_60);
      if ((*(ulong *)(this + 8) & 1) == 0) goto LAB_00133d76;
      uVar6 = *(ulong *)(this + 8) & 0xfffffffffffffffe;
      newCapacity = 0x10;
      if (uVar6 != 0) {
        newCapacity = uVar6;
      }
      setCapacity(this,context,newCapacity);
      internalAtPut(this,context,(Oop)local_40,(Oop)local_60);
      OopRef::unregisterSelf((OopRef *)&local_60);
      OopRef::unregisterSelf((OopRef *)&local_40);
    }
    else {
      lVar1 = *(long *)(this + 0x18);
      if (lVar1 == 0) {
        __assert_fail("keyValues",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/Collections.hpp"
                      ,0x16c,"Oop *Lodtalk::MethodDictionary::getHashTableKeys() const");
      }
      lVar3 = *(long *)(this + 0x20);
      if (lVar3 == 0) {
        __assert_fail("values",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/Collections.hpp"
                      ,0x172,"Oop *Lodtalk::MethodDictionary::getHashTableValues() const");
      }
      puVar4 = *(undefined8 **)(lVar1 + 8 + uVar11 * 8);
      *(anon_union_8_4_0eb573b0_for_Oop_0 *)(lVar1 + 8 + uVar11 * 8) = key.field_0;
      *(anon_union_8_4_0eb573b0_for_Oop_0 *)(lVar3 + 8 + uVar11 * 8) = value.field_0;
      if ((puVar4 == &NilObject) &&
         (lVar1 = *(long *)(this + 0x10), *(long *)(this + 0x10) = lVar1 + 2,
         (*(long *)(this + 8) << 2) / 5 < lVar1 + 2)) {
        increaseCapacity(this,context);
        return;
      }
    }
    return;
  }
LAB_00133d76:
  __assert_fail("isSmallInteger()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                ,0x200,"SmallIntegerValue Lodtalk::Oop::decodeSmallInteger() const");
}

Assistant:

void internalAtPut(VMContext *context, Oop key, Oop value)
	{
		// If a slot was not found, try to increase the capacity.
		auto position = findKeyPosition(key, identityFunction<Oop>, identityHashOf, identityOopEquals);
		if(position < 0)
		{
            OopRef keyRef(context, key);
            OopRef valueRef(context, value);
			increaseCapacity(context);
            return internalAtPut(context, keyRef.oop, valueRef.oop);
		}

		// Put the key and value.
		auto keyArray = getHashTableKeys();
		auto valueArray = getHashTableValues();
		auto oldKey = keyArray[position];
		keyArray[position] = key;
		valueArray[position] = value;

		// Increase the size.
		if(isNil(oldKey))
			increaseSize(context);
	}